

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

container_t * container_clone(container_t *c,uint8_t typecode)

{
  int iVar1;
  bitset_container_t *pbVar2;
  array_container_t *paVar3;
  run_container_t *prVar4;
  uint uVar5;
  undefined7 in_register_00000031;
  
  uVar5 = (uint)CONCAT71(in_register_00000031,typecode);
  if (uVar5 == 4) {
    uVar5 = (uint)*(byte *)((long)c + 8);
    if (*(byte *)((long)c + 8) == 4) {
      __assert_fail("*type != SHARED_CONTAINER_TYPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1062,
                    "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
    }
    c = *c;
  }
  if ((char)uVar5 == '\x03') {
    prVar4 = run_container_clone((run_container_t *)c);
    return prVar4;
  }
  if ((uVar5 & 0xff) == 2) {
    paVar3 = array_container_create_given_capacity(((run_container_t *)c)->capacity);
    if (paVar3 == (array_container_t *)0x0) {
      paVar3 = (array_container_t *)0x0;
    }
    else {
      iVar1 = ((run_container_t *)c)->n_runs;
      paVar3->cardinality = iVar1;
      memcpy(paVar3->array,((run_container_t *)c)->runs,(long)iVar1 * 2);
    }
    return paVar3;
  }
  if ((uVar5 & 0xff) == 1) {
    pbVar2 = bitset_container_clone((bitset_container_t *)c);
    return pbVar2;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                ,0x2d2f,"container_t *container_clone(const container_t *, uint8_t)");
}

Assistant:

container_t *container_clone(const container_t *c, uint8_t typecode) {
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_clone(const_CAST_bitset(c));
        case ARRAY_CONTAINER_TYPE:
            return array_container_clone(const_CAST_array(c));
        case RUN_CONTAINER_TYPE:
            return run_container_clone(const_CAST_run(c));
        case SHARED_CONTAINER_TYPE:
            printf("shared containers are not cloneable\n");
            assert(false);
            return NULL;
        default:
            assert(false);
            __builtin_unreachable();
            return NULL;
    }
}